

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

void __thiscall
Refal2::CArbitraryInteger::subFromBigger(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  pointer puVar1;
  uint *puVar2;
  uint in_EAX;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  pointer puVar6;
  ulong __new_size;
  uint uVar7;
  bool bVar8;
  undefined8 uStack_18;
  
  uVar3 = (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  __new_size = (long)(operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  if (__new_size < uVar3) {
    __new_size = uVar3;
  }
  uStack_18 = (ulong)in_EAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,__new_size,
             (value_type *)((long)&uStack_18 + 4));
  puVar4 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar6 == puVar1) {
    bVar8 = false;
  }
  else {
    puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar8 = false;
    do {
      if (puVar4 == puVar2) {
        __assert_fail("i != end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x155,
                      "void Refal2::CArbitraryInteger::subFromBigger(const CArbitraryInteger &)");
      }
      uVar5 = (uint)bVar8;
      bVar8 = *puVar4 < uVar5 + *puVar6;
      uVar7 = *puVar4 - (uVar5 + *puVar6);
      uVar5 = uVar7 + 0x1000000;
      if (!bVar8) {
        uVar5 = uVar7;
      }
      *puVar4 = uVar5;
      puVar6 = puVar6 + 1;
      puVar4 = puVar4 + 1;
    } while (puVar6 != puVar1);
  }
  if (bVar8) {
    puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (puVar4 == puVar2) {
        __assert_fail("i != end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x162,
                      "void Refal2::CArbitraryInteger::subFromBigger(const CArbitraryInteger &)");
      }
      if (*puVar4 != 0) {
        *puVar4 = *puVar4 - 1;
        bVar8 = false;
      }
      puVar4 = puVar4 + 1;
    } while (bVar8);
  }
  return;
}

Assistant:

void CArbitraryInteger::subFromBigger( const CArbitraryInteger& operand )
{
	resize( std::max( size(), operand.size() ), 0 );
	iterator i = begin();
	const_iterator j = operand.cbegin();
	bool take = false;
	while( j != operand.cend() ) {
		assert( i != end() );
		TDigit sub = *j + ( take ? 1 : 0 );
		if( *i < sub ) {
			*i += Base - sub;
			take = true;
		} else {
			*i -= sub;
			take = false;
		}
		++j;
		++i;
	}
	while( take ) {
		assert( i != end() );
		if( *i > 0 ) {
			( *i )--;
			take = false;
		}
		++i;
	}
}